

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O0

LispPTR COM_closefile(LispPTR *args)

{
  int iVar1;
  LispPTR *pLVar2;
  char *pcVar3;
  DLword *pDVar4;
  int *piVar5;
  bool bVar6;
  bool bVar7;
  uint local_2260;
  uint local_225c;
  uint local_2258;
  uint local_2254;
  LispPTR local_224c;
  int local_2248;
  char *local_2240;
  char *lf_cp;
  size_t lf_ii;
  size_t lf_i;
  char *lf_dptr;
  char *lf_sptr;
  size_t lf_length;
  short *lf_sbase;
  char *lf_dp;
  char *lf_base;
  OneDArray *lf_arrayp_1;
  OneDArray *lf_arrayp;
  timespec timesp [2];
  stat sbuf;
  char file [4096];
  char host [255];
  char lfname [4101];
  time_t cdate;
  int rval;
  int dskp;
  int fatp;
  int fd;
  LispPTR *args_local;
  
  iVar1 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar1 == 0) {
    Lisp_errno = (int *)NativeAligned4FromLAddr(args[3]);
    pLVar2 = NativeAligned4FromLAddr(*args);
    if (*(char *)((long)pLVar2 + 6) == 'C') {
      cdate._0_4_ = pLVar2[2];
      rval = 0;
    }
    else if (*(char *)((long)pLVar2 + 6) == 'D') {
      cdate._0_4_ = pLVar2[2] << 1;
      rval = 1;
    }
    else {
      error("LispStringLength: Not a character array.\n");
    }
    if (rval == 0) {
      local_2248 = (LispPTR)cdate + 3;
    }
    else {
      local_2248 = (LispPTR)cdate + 5;
    }
    if (local_2248 < 0x1006) {
      pLVar2 = NativeAligned4FromLAddr(*args);
      if ((int)pLVar2[2] < 0x1000) {
        local_224c = pLVar2[2];
      }
      else {
        local_224c = 0x1000;
      }
      pcVar3 = (char *)(long)(int)local_224c;
      if (*(char *)((long)pLVar2 + 6) == 'C') {
        pDVar4 = NativeAligned2FromLAddr(*pLVar2 & 0xfffffff);
        lf_i = (size_t)(host + 0xf8);
        lf_dptr = (char *)((long)pDVar4 + (long)(int)(uint)(ushort)pLVar2[1]);
        for (lf_ii = 0; lf_ii < pcVar3; lf_ii = lf_ii + 1) {
          *(undefined1 *)lf_i = *(undefined1 *)((ulong)lf_dptr ^ 3);
          lf_i = lf_i + 1;
          lf_dptr = lf_dptr + 1;
        }
        (host + 0xf8)[(long)pcVar3] = '\0';
      }
      else if (*(char *)((long)pLVar2 + 6) == 'D') {
        pDVar4 = NativeAligned2FromLAddr(*pLVar2 & 0xfffffff);
        lf_length = (size_t)(pDVar4 + (int)(uint)(ushort)pLVar2[1]);
        lf_sbase = (short *)(host + 0xf8);
        for (lf_cp = (char *)0x0; lf_cp < pcVar3; lf_cp = lf_cp + 1) {
          *(char *)lf_sbase = (char)*(undefined2 *)(lf_length ^ 2);
          lf_length = lf_length + 2;
          lf_sbase = (short *)((long)lf_sbase + 1);
        }
        *(undefined1 *)lf_sbase = 0;
      }
      else {
        error("LispStringToCString: Not a character array.\n");
      }
      separate_host(host + 0xf8,file + 0xff8);
      for (local_2240 = file + 0xff8; *local_2240 != '\0'; local_2240 = local_2240 + 1) {
        if (('`' < *local_2240) && (*local_2240 < '{')) {
          *local_2240 = *local_2240 + -0x20;
        }
      }
      iVar1 = strcmp(file + 0xff8,"DSK");
      if (iVar1 == 0) {
        bVar7 = true;
      }
      else {
        iVar1 = strcmp(file + 0xff8,"UNIX");
        if (iVar1 != 0) {
          return 0;
        }
        bVar7 = false;
      }
      if (bVar7) {
        unixpathname(host + 0xf8,(char *)(sbuf.__glibc_reserved + 2),1,0);
      }
      else {
        unixpathname(host + 0xf8,(char *)(sbuf.__glibc_reserved + 2),0,0);
      }
      if ((args[1] & 0xfff0000) == 0xe0000) {
        local_2254 = args[1] & 0xffff;
      }
      else {
        if ((args[1] & 0xfff0000) == 0xf0000) {
          local_2258 = args[1] | 0xffff0000;
        }
        else {
          pLVar2 = NativeAligned4FromLAddr(args[1]);
          local_2258 = *pLVar2;
        }
        local_2254 = local_2258;
      }
      if ((args[2] & 0xfff0000) == 0xe0000) {
        local_225c = args[2] & 0xffff;
      }
      else {
        if ((args[2] & 0xfff0000) == 0xf0000) {
          local_2260 = args[2] | 0xffff0000;
        }
        else {
          pLVar2 = NativeAligned4FromLAddr(args[2]);
          local_2260 = *pLVar2;
        }
        local_225c = local_2260;
      }
      if (!bVar7) {
        alarm(TIMEOUT_TIME);
        do {
          piVar5 = __errno_location();
          *piVar5 = 0;
          iVar1 = fstat(local_2254,(stat *)&timesp[1].tv_nsec);
          bVar6 = false;
          if (iVar1 == -1) {
            piVar5 = __errno_location();
            bVar6 = *piVar5 == 4;
          }
        } while (bVar6);
        alarm(0);
        if (iVar1 == -1) {
          piVar5 = __errno_location();
          *Lisp_errno = *piVar5;
          return 0;
        }
      }
      if (local_225c == 0) {
        alarm(TIMEOUT_TIME);
        do {
          piVar5 = __errno_location();
          *piVar5 = 0;
          iVar1 = close(local_2254);
          bVar6 = false;
          if (iVar1 == -1) {
            piVar5 = __errno_location();
            bVar6 = *piVar5 == 4;
          }
        } while (bVar6);
        alarm(0);
        if (iVar1 == -1) {
          if (((bVar7) || (piVar5 = __errno_location(), *piVar5 != 1)) ||
             (((uint)sbuf.st_nlink & 0xf000) == 0x8000)) {
            piVar5 = __errno_location();
            *Lisp_errno = *piVar5;
            args_local._4_4_ = 0;
          }
          else {
            args_local._4_4_ = 0x4c;
          }
        }
        else {
          args_local._4_4_ = 0x4c;
        }
      }
      else {
        lf_arrayp = (OneDArray *)sbuf.st_blocks;
        timesp[0].tv_sec = 0;
        timesp[0].tv_nsec = (__syscall_slong_t)(int)(local_225c + 0xfe36b500);
        timesp[1].tv_sec = 0;
        alarm(TIMEOUT_TIME);
        do {
          piVar5 = __errno_location();
          *piVar5 = 0;
          iVar1 = futimens(local_2254,(timespec *)&lf_arrayp);
          bVar7 = false;
          if (iVar1 == -1) {
            piVar5 = __errno_location();
            bVar7 = *piVar5 == 4;
          }
        } while (bVar7);
        alarm(0);
        if (iVar1 == 0) {
          alarm(TIMEOUT_TIME);
          do {
            piVar5 = __errno_location();
            *piVar5 = 0;
            iVar1 = close(local_2254);
            bVar7 = false;
            if (iVar1 == -1) {
              piVar5 = __errno_location();
              bVar7 = *piVar5 == 4;
            }
          } while (bVar7);
          alarm(0);
          if (iVar1 == -1) {
            piVar5 = __errno_location();
            *Lisp_errno = *piVar5;
            args_local._4_4_ = 0;
          }
          else {
            args_local._4_4_ = 0x4c;
          }
        }
        else {
          piVar5 = __errno_location();
          *Lisp_errno = *piVar5;
          args_local._4_4_ = 0;
        }
      }
    }
    else {
      *Lisp_errno = 200;
      args_local._4_4_ = 0;
    }
  }
  else {
    *Lisp_errno = 100;
    args_local._4_4_ = 0;
  }
  return args_local._4_4_;
}

Assistant:

LispPTR COM_closefile(LispPTR *args)
{
#ifdef DOS

  int fd, dskp, rval;
  time_t cdate;
  char lfname[MAXPATHLEN + 5], host[MAXNAMLEN];
  char file[MAXPATHLEN], dir[MAXPATHLEN], name[MAXNAMLEN + 1];
  char ver[VERSIONLEN], drive[1];
  struct find_t dirp;
  int dp;
  struct stat sbuf;
  ino_t ino;
  int extlen;
  char rawname[MAXNAMLEN];

  ERRSETJMP(NIL);
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[3]);

  LispStringLength(args[0], rval, dskp);

  /*
   * Because of the version number convention, Lisp pathname might
   * be shorter than UNIX one.  For THIN string, the difference
   * is 2 bytes, for FAT string, 4 bytes.  Add 1 byte for NULL
   * terminating character.
   */
  rval = dskp ? rval + 4 + 1 : rval + 2 + 1;
  /* Add five for the host name field in Lisp format. */
  if (rval > MAXPATHLEN + 5) FileNameTooLong(NIL);

  LispStringToCString(args[0], lfname, MAXPATHLEN);

  separate_host(lfname, host, drive);

  UPCASE(host);
  if (strcmp(host, "DSK") == 0)
    dskp = 1;
  else if (strcmp(host, "UNIX") == 0)
    dskp = 0;
  else
    return (NIL);

  /*
   * Convert a Lisp file name to UNIX one.  If host is DSK, we also have to
   * convert a version field.
   */
  dskp ? unixpathname(lfname, file, 1, 0, drive, &extlen, rawname)
       : unixpathname(lfname, file, 0, 0, drive, &extlen, rawname);
  fd = LispNumToCInt(args[1]);
  cdate = (time_t)LispNumToCInt(args[2]);
  if (!dskp) {
    TIMEOUT(rval = fstat(fd, &sbuf));
    if (rval == -1) {
      *Lisp_errno = errno;
      return (NIL);
    }
  }

  if (cdate == 0) {
    /* Just close. */
    TIMEOUT(rval = close(fd));
    if (rval == -1) {
      if (!dskp && errno == EPERM && !S_ISREG(sbuf.st_mode)) {
        /*
         * On {UNIX} device, closing a special file we are not
         * the owner of it.  Although I don't think close fails
         * because of EPERM, in honor of Medley 1.1 code, I put
         * this segment here.
         */
        return (ATOM_T);
      } else {
        *Lisp_errno = errno;
        return (NIL);
      }
    } else {
      return (ATOM_T);
    }
  }

  if (!unpack_filename(file, dir, name, ver, 1)) return (NIL);

  if (dskp) {
    /*
     * On {DSK}, we have to make sure dir is case sensitively existing
     * directory.
     */
    if (true_name(dir) != -1) return (NIL);

    /*
     * There is a very troublesome problem here.  The file name Lisp
     * recognizes is not always the same as the name which COM_openfile
     * used to open the file.  Sometimes COM_openfile uses the versionless
     * file name to open a file, although Lisp always recognizes with
     * *versioned* file name.
     * Thus, we compare i-node number of the requested file with ones of all
     * of files on the directory.   This is time spending implementation.
     * More clean up work is needed.
     */
    TIMEOUT(rval = fstat(fd, &sbuf));
    if (rval != 0) {
      *Lisp_errno = errno;
      return (NIL);
    }
    ino = sbuf.st_ino;
    TIMEOUT(rval = _dos_findfirst(dir, _A_SUBDIR, &dirp));
    if (rval < 0) {
      *Lisp_errno = errno;
      return (NIL);
    }

    for (; rval == 0; S_TOUT(rval = _dos_findnext(&dirp))) {
      sprintf(file, "%s\\%s", dir, dirp.name);
    }
  }
#ifndef DOS /* effectively NEVER, since we're in an ifdef DOS */
  time[0].tv_sec = (long)sbuf.st_atime;
  time[0].tv_usec = 0L;
  time[1].tv_sec = (long)ToUnixTime(cdate);
  time[1].tv_usec = 0L;
#endif /* DOS */
  TIMEOUT(rval = close(fd));
  if (rval == -1) {
    *Lisp_errno = errno;
    return (NIL);
  }
#ifndef DOS /* effectively NEVER, since we're in an ifdef DOS */
  TIMEOUT(rval = utimes(file, time));
  if (rval != 0) {
    *Lisp_errno = errno;
    return (NIL);
  }
#endif /* DOS, internal */
#else  /* UNIX version of CLOSEFILE */
  int fd, fatp, dskp, rval;
  time_t cdate;
  char lfname[MAXPATHLEN + 5], host[MAXNAMLEN];
  char file[MAXPATHLEN];
  struct stat sbuf;
  struct timespec timesp[2];

  ERRSETJMP(NIL);
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[3]);

  LispStringLength(args[0], rval, fatp);
  /*
   * Because of the version number convention, Lisp pathname might
   * be shorter than UNIX one.  For THIN string, the difference
   * is 2 bytes, for FAT string, 4 bytes.  Add 1 byte for NULL
   * terminating character.
   */
  rval = fatp ? rval + 4 + 1 : rval + 2 + 1;
  /* Add five for the host name field in Lisp format. */
  if (rval > MAXPATHLEN + 5) FileNameTooLong(NIL);

  LispStringToCString(args[0], lfname, MAXPATHLEN);

  separate_host(lfname, host);
  UPCASE(host);
  if (strcmp(host, "DSK") == 0)
    dskp = 1;
  else if (strcmp(host, "UNIX") == 0)
    dskp = 0;
  else
    return (NIL);

  /*
   * Convert a Lisp file name to UNIX one.  If host is DSK, we also have to
   * convert a version field.
   */
  dskp ? unixpathname(lfname, file, 1, 0) : unixpathname(lfname, file, 0, 0);

  fd = LispNumToCInt(args[1]);
  cdate = (time_t)LispNumToCInt(args[2]);

  if (!dskp) {
    TIMEOUT(rval = fstat(fd, &sbuf));
    if (rval == -1) {
      *Lisp_errno = errno;
      return (NIL);
    }
  }

  if (cdate == 0) {
    /* Just close. */
    TIMEOUT(rval = close(fd));
    if (rval == -1) {
      if (!dskp && errno == EPERM && !S_ISREG(sbuf.st_mode)) {
        /*
         * On {UNIX} device, closing a special file we are not
         * the owner of it.  Although I don't think close fails
         * because of EPERM, in honor of Medley 1.1 code, I put
         * this segment here.
         */
        return (ATOM_T);
      } else {
        *Lisp_errno = errno;
        return (NIL);
      }
    } else {
      return (ATOM_T);
    }
  }

  /* introduction of futimens() allows us to set the times on an open
   * file descriptor so a lot of directory manipulation to find the
   * appropriate name associated with the inode is no longer required
   */

  timesp[0].tv_sec = (long)sbuf.st_atime;
  timesp[0].tv_nsec = 0L;
  timesp[1].tv_sec = (long)ToUnixTime(cdate);
  timesp[1].tv_nsec = 0L;

  TIMEOUT(rval = futimens(fd, timesp));
  if (rval != 0) {
    *Lisp_errno = errno;
    return (NIL);
  }

  TIMEOUT(rval = close(fd));
  if (rval == -1) {
    *Lisp_errno = errno;
    return (NIL);
  }

#endif /* DOS */

  return (ATOM_T);
}